

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_crecord.c
# Opt level: O0

CTypeID crec_constructor(jit_State *J,GCcdata *cd,TRef tr)

{
  CTypeID k;
  TRef TVar1;
  TRef TVar2;
  CTypeID id;
  TRef tr_local;
  GCcdata *cd_local;
  jit_State *J_local;
  
  k = (CTypeID)cd[1].nextgc.gcptr64;
  (J->fold).ins.field_0.ot = 0x4513;
  (J->fold).ins.field_0.op1 = (IRRef1)tr;
  (J->fold).ins.field_0.op2 = 0x18;
  TVar1 = lj_opt_fold(J);
  TVar2 = lj_ir_kint(J,k);
  (J->fold).ins.field_0.ot = 0x893;
  (J->fold).ins.field_0.op1 = (IRRef1)TVar1;
  (J->fold).ins.field_0.op2 = (IRRef1)TVar2;
  lj_opt_fold(J);
  return k;
}

Assistant:

static CTypeID crec_constructor(jit_State *J, GCcdata *cd, TRef tr)
{
  CTypeID id;
  lj_assertJ(tref_iscdata(tr) && cd->ctypeid == CTID_CTYPEID,
	     "expected CTypeID cdata");
  id = *(CTypeID *)cdataptr(cd);
  tr = emitir(IRT(IR_FLOAD, IRT_INT), tr, IRFL_CDATA_INT);
  emitir(IRTG(IR_EQ, IRT_INT), tr, lj_ir_kint(J, (int32_t)id));
  return id;
}